

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
::insert_at<std::__cxx11::string>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
          *this,size_type pos,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  length_error *this_00;
  
  lVar3 = *(long *)(this + 0x88);
  if (0x7fffffffffffffe < (ulong)(lVar3 - *(long *)(this + 0x80))) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  if (*(long *)(this + 0x80) != 0) {
    bVar2 = Hasher::operator()((Hasher *)(this + 0x30),(string *)(this + 0x40),
                               (string *)(*(long *)(this + 0xa0) + pos * 0x20));
    if (bVar2) {
      if (*(long *)(this + 0x80) == 0) {
        lVar3 = -1;
      }
      else {
        Hasher::operator()((Hasher *)(this + 0x30),(string *)(this + 0x40),
                           (string *)(pos * 0x20 + *(long *)(this + 0xa0)));
        lVar3 = *(long *)(this + 0x80) + -1;
      }
      *(long *)(this + 0x80) = lVar3;
      goto LAB_00a265e0;
    }
    lVar3 = *(long *)(this + 0x88);
  }
  *(long *)(this + 0x88) = lVar3 + 1;
LAB_00a265e0:
  set_value<std::__cxx11::string>(this,(pointer)(*(long *)(this + 0xa0) + pos * 0x20),args);
  lVar3 = *(long *)(this + 0x90);
  lVar1 = *(long *)(this + 0xa0);
  __return_storage_ptr__->ht =
       (dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  __return_storage_ptr__->pos = (pointer)(pos * 0x20 + lVar1);
  __return_storage_ptr__->end = (pointer)(lVar3 * 0x20 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

iterator insert_at(size_type pos, Args&&... args) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been del.
      // shrug: shouldn't need to be const.
      const_iterator delpos(this, table + pos, table + num_buckets, false);
      clear_deleted(delpos);
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    } else {
      ++num_elements;  // replacing an empty bucket
    }
    set_value(&table[pos], std::forward<Args>(args)...);
    return iterator(this, table + pos, table + num_buckets, false);
  }